

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

optional<std::shared_ptr<WhileStatementAstNode>_> * __thiscall
Parser::parseWhileStatement
          (optional<std::shared_ptr<WhileStatementAstNode>_> *__return_storage_ptr__,Parser *this)

{
  bool *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  TokenType type;
  undefined1 local_a8 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  undefined1 local_88 [16];
  shared_ptr<ExpressionAstNode> local_78;
  undefined1 local_68 [8];
  optional<std::shared_ptr<ExpressionAstNode>_> expression;
  optional<std::shared_ptr<StatementAstNode>_> statement;
  byte local_29;
  bool error;
  
  local_29 = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected a while",(allocator<char> *)local_68);
  this_00 = &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
             _M_payload.
             super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
             super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged;
  type = (TokenType)this;
  expect((Parser *)local_a8,type,(bool *)0xf,(string *)&local_29);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
  std::__cxx11::string::~string((string *)this_00);
  skipWhiteSpace(this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected a left paren after while",(allocator<char> *)local_68);
  expect((Parser *)(local_a8 + 0x10),type,(bool *)0x5,(string *)&local_29);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  std::__cxx11::string::~string((string *)this_00);
  parseExpression((optional<std::shared_ptr<ExpressionAstNode>_> *)local_68,this);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,
             "Expected a right paren after expression of while",(allocator<char> *)&local_78);
  expect((Parser *)local_88,type,(bool *)0x6,(string *)&local_29);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  std::__cxx11::string::~string
            ((string *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged);
  parseStatement((optional<std::shared_ptr<StatementAstNode>_> *)
                 &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
                  _M_payload.
                  super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
                  super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged,this)
  ;
  if (((local_29 == 0) &&
      (expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>._M_payload.
       super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
       super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_payload._8_1_ == '\x01')
      ) && (local_29 = statement.
                       super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
                       _M_payload.
                       super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
                       .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload.
                       _8_1_ ^ 1,
           statement.super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
           _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>
           .super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_payload._8_1_ !=
           '\0')) {
    std::
    make_shared<WhileStatementAstNode,std::shared_ptr<ExpressionAstNode>&,std::shared_ptr<StatementAstNode>&>
              (&local_78,(shared_ptr<StatementAstNode> *)local_68);
    _Var1._M_pi = local_78.super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<WhileStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<WhileStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<WhileStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<WhileStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)
         local_78.super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_78.super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<WhileStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<WhileStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<WhileStatementAstNode>_>._M_payload._M_value.
    super___shared_ptr<WhileStatementAstNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         _Var1._M_pi;
    local_78.super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<WhileStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<WhileStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<WhileStatementAstNode>_>._M_engaged = true;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.super___shared_ptr<ExpressionAstNode,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::shared_ptr<WhileStatementAstNode>,_false,_false>)._M_payload.
    super__Optional_payload<std::shared_ptr<WhileStatementAstNode>,_true,_false,_false>.
    super__Optional_payload_base<std::shared_ptr<WhileStatementAstNode>_>._M_engaged = false;
  }
  std::_Optional_payload_base<std::shared_ptr<StatementAstNode>_>::_M_reset
            ((_Optional_payload_base<std::shared_ptr<StatementAstNode>_> *)
             &expression.super__Optional_base<std::shared_ptr<ExpressionAstNode>,_false,_false>.
              _M_payload.
              super__Optional_payload<std::shared_ptr<ExpressionAstNode>,_true,_false,_false>.
              super__Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>._M_engaged);
  std::_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_>::_M_reset
            ((_Optional_payload_base<std::shared_ptr<ExpressionAstNode>_> *)local_68);
  return __return_storage_ptr__;
}

Assistant:

const std::optional<std::shared_ptr<WhileStatementAstNode>>
Parser::parseWhileStatement() noexcept {
  bool error = false;

  this->expect(TokenType::While, error, "Expected a while");

  this->skipWhiteSpace();

  this->expect(TokenType::LeftParen, error, "Expected a left paren after while");

  auto expression = this->parseExpression();

  this->expect(TokenType::RightParen, error, "Expected a right paren after expression of while");

  auto statement = this->parseStatement();

  error = error || !expression || !statement;

  if (error) { return std::nullopt; }

  return std::make_shared<WhileStatementAstNode>(expression.value(), statement.value());
}